

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.cpp
# Opt level: O1

void __thiscall duckdb::ProgressBar::Update(ProgressBar *this,bool final)

{
  double dVar1;
  bool bVar2;
  idx_t iVar3;
  pointer pPVar4;
  undefined7 in_register_00000031;
  ProgressData local_48;
  double local_28;
  undefined8 uStack_20;
  
  if (((int)CONCAT71(in_register_00000031,final) != 0) || (this->supported == true)) {
    local_48.done = 0.0;
    local_48.total = 0.0;
    local_48.invalid = false;
    iVar3 = Executor::GetPipelinesProgress(this->executor,&local_48);
    dVar1 = 0.0;
    if (((iVar3 == 0) &&
        (((dVar1 = 0.0, local_48.invalid == false && (dVar1 = 0.0, 0.0 <= local_48.done)) &&
         (dVar1 = 0.0, local_48.done <= local_48.total)))) && (dVar1 = 0.0, 0.0 <= local_48.total))
    {
      if (1e+15 < local_48.total) {
        if ((local_48.done < 0.0) || (local_48.total < local_48.done)) {
          local_48.invalid = true;
          local_48.total = 1.0;
          local_48.done = 0.0;
        }
        else {
          local_48.done = local_48.done / local_48.total;
          local_48.total = 1e+15;
          local_48.done = local_48.done * 1e+15;
        }
      }
      LOCK();
      (this->query_progress).rows_processed.super___atomic_base<unsigned_long>._M_i =
           (long)local_48.done >> 0x3f & (long)(local_48.done - 9.223372036854776e+18) |
           (long)local_48.done;
      UNLOCK();
      LOCK();
      (this->query_progress).total_rows_to_process.super___atomic_base<unsigned_long>._M_i =
           (long)local_48.total >> 0x3f & (long)(local_48.total - 9.223372036854776e+18) |
           (long)local_48.total;
      UNLOCK();
      dVar1 = (local_48.done / local_48.total) * 100.0;
    }
    if (iVar3 == 0 || final) {
      if ((this->query_progress).percentage._M_i < dVar1) {
        LOCK();
        (this->query_progress).percentage._M_i = dVar1;
        UNLOCK();
      }
      bVar2 = ShouldPrint(this,final);
      if (bVar2) {
        if (final) {
          FinishProgressBarPrint(this);
        }
        else {
          local_28 = (this->query_progress).percentage._M_i;
          uStack_20 = 0;
          pPVar4 = unique_ptr<duckdb::ProgressBarDisplay,_std::default_delete<duckdb::ProgressBarDisplay>,_true>
                   ::operator->(&this->display);
          (*pPVar4->_vptr_ProgressBarDisplay[2])(SUB84((double)(int)local_28,0),pPVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void ProgressBar::Update(bool final) {
	if (!final && !supported) {
		return;
	}

	ProgressData progress;
	idx_t invalid_pipelines = executor.GetPipelinesProgress(progress);

	double new_percentage = 0.0;
	if (invalid_pipelines == 0 && progress.IsValid()) {
		if (progress.total > 1e15) {
			progress.Normalize(1e15);
		}
		query_progress.rows_processed = idx_t(progress.done);
		query_progress.total_rows_to_process = idx_t(progress.total);
		new_percentage = progress.ProgressDone() * 100;
	}

	if (!final && invalid_pipelines > 0) {
		return;
	}

	if (new_percentage > query_progress.percentage) {
		query_progress.percentage = new_percentage;
	}
	if (ShouldPrint(final)) {
		if (final) {
			FinishProgressBarPrint();
		} else {
			PrintProgress(LossyNumericCast<int>(query_progress.percentage.load()));
		}
	}
}